

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate2.hpp
# Opt level: O1

bool __thiscall
qclab::qgates::PointerGate2<float>::equals(PointerGate2<float> *this,QObject<float> *other)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = __dynamic_cast(other,&QObject<float>::typeinfo,&typeinfo,0);
  if (lVar3 == 0) {
    iVar2 = (*other->_vptr_QObject[0xe])(other,this->gate_);
    return SUB41(iVar2,0);
  }
  bVar1 = (**(code **)(**(long **)(lVar3 + 0x10) + 0x70))(*(long **)(lVar3 + 0x10),this->gate_);
  return (bool)(bVar1 & 1);
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate2< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }